

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

Map * Map_Push_And_Get(Map *tree,void *str,size_t size,void *id)

{
  Map *tree_00;
  Map *pMVar1;
  size_t local_40;
  Map *local_38;
  
  local_38 = tree;
  Map_Scour(tree,str,size,&local_40,&local_38);
  pMVar1 = local_38;
  if (local_40 == size) {
    if (local_38->ID == (void *)0x0) goto LAB_00143a95;
  }
  else {
    for (; local_40 < size; local_40 = local_40 + 1) {
      tree_00 = (Map *)malloc(0x810);
      pMVar1->delta[*(byte *)((long)str + local_40)] = tree_00;
      Map_Init(tree_00);
      pMVar1 = tree_00;
    }
  }
  pMVar1->ID = id;
LAB_00143a95:
  pMVar1->is_final = '\x01';
  return pMVar1;
}

Assistant:

struct Map* Map_Push_And_Get(struct Map* tree,void *str,size_t size,void *id)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);	

	if(temp == size)
	{
		if(tree->ID!=NULL)tree->ID=id;
		tree->is_final=1;
		return tree;
	}

	for(temp;temp<size;++temp)
	{
		Map_Init(
			tree=
			tree->delta[((unsigned char*)str)[temp]]=
			malloc(sizeof(Map))
			);
	}

	tree->ID=id;
	tree->is_final=1;
	return tree;
}